

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O0

void __thiscall
SuffixTest_VisitIntSuffixValues_Test::TestBody(SuffixTest_VisitIntSuffixValues_Test *this)

{
  long lVar1;
  SuffixBase SVar2;
  MockValueVisitor *this_00;
  long in_RDI;
  MockValueVisitor v;
  MutIntSuffix s;
  char *in_stack_fffffffffffffe18;
  BasicStringRef<char> *in_stack_fffffffffffffe20;
  MockValueVisitor *v_00;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar3;
  string *this_01;
  int value;
  Matcher<int> *in_stack_fffffffffffffe50;
  SuffixTable *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  BasicSuffixSet<std::allocator<char>_> *in_stack_fffffffffffffe68;
  StringRef in_stack_fffffffffffffe70;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  MockSpec<void_(int,_int)> *in_stack_ffffffffffffff30;
  string local_40 [48];
  SuffixBase local_10;
  
  lVar1 = in_RDI + 0x10;
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  this_01 = local_40;
  std::__cxx11::string::string(this_01);
  SVar2.impl_ = (Impl *)mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
                                  (in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,
                                   in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,
                                   in_stack_fffffffffffffe58);
  local_10.impl_ = SVar2.impl_;
  std::__cxx11::string::~string(local_40);
  value = SUB84(SVar2.impl_,4);
  v_00 = (MockValueVisitor *)&stack0xfffffffffffffff0;
  uVar3 = 0;
  mp::BasicMutSuffix<int>::set_value
            ((BasicMutSuffix<int> *)this_01,(int)((ulong)lVar1 >> 0x20),(int)lVar1);
  mp::BasicMutSuffix<int>::set_value
            ((BasicMutSuffix<int> *)this_01,(int)((ulong)lVar1 >> 0x20),(int)lVar1);
  mp::BasicMutSuffix<int>::set_value
            ((BasicMutSuffix<int> *)this_01,(int)((ulong)lVar1 >> 0x20),(int)lVar1);
  MockValueVisitor::MockValueVisitor((MockValueVisitor *)CONCAT44(uVar3,in_stack_fffffffffffffe30));
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffe50,value);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffe50,value);
  this_00 = (MockValueVisitor *)
            MockValueVisitor::gmock_Visit
                      ((MockValueVisitor *)CONCAT44(uVar3,in_stack_fffffffffffffe30),
                       (Matcher<int> *)v_00,(Matcher<int> *)in_stack_fffffffffffffe20);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116364);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116371);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffe50,value);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffe50,value);
  MockValueVisitor::gmock_Visit
            ((MockValueVisitor *)CONCAT44(uVar3,in_stack_fffffffffffffe30),(Matcher<int> *)v_00,
             (Matcher<int> *)this_00);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x1163df);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x1163e9);
  mp::BasicSuffix<int>::VisitValues<MockValueVisitor>
            ((BasicSuffix<int> *)CONCAT44(uVar3,in_stack_fffffffffffffe30),v_00);
  MockValueVisitor::~MockValueVisitor(this_00);
  return;
}

Assistant:

TEST_F(SuffixTest, VisitIntSuffixValues) {
  mp::MutIntSuffix s = suffixes_.Add<int>("test", 0, 3);
  s.set_value(0, 42);
  s.set_value(1, 0);
  s.set_value(2, 11);
  MockValueVisitor v;
  EXPECT_CALL(v, Visit(0, Matcher<int>(42)));
  EXPECT_CALL(v, Visit(2, Matcher<int>(11)));
  s.VisitValues(v);
}